

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dense.hpp
# Opt level: O2

matrix_type * __thiscall
Disa::Matrix_Dense<double,2ul,2ul>::operator-=
          (Matrix_Dense<double,2ul,2ul> *this,Matrix_Dense<double,_0UL,_0UL> *matrix)

{
  ostream *poVar1;
  size_t __val;
  source_location *in_RCX;
  long lVar2;
  Matrix_Dense<double,2ul,2ul> *this_00;
  pair<unsigned_long,_unsigned_long> pVar3;
  string sStack_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined **local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pVar3 = Matrix_Dense<double,_0UL,_0UL>::size(matrix);
  if ((pVar3.first == 2) && (pVar3.second == 2)) {
    this_00 = this;
    for (lVar2 = 0; lVar2 != 0x30; lVar2 = lVar2 + 0x18) {
      Vector_Dense<double,2ul>::operator-=
                ((Vector_Dense<double,2ul> *)this_00,
                 (Vector_Dense<double,_0UL> *)
                 ((long)&(((matrix->
                           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                           ).
                           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<double,_std::allocator<double>_>).
                         super__Vector_base<double,_std::allocator<double>_> + lVar2));
      this_00 = (Matrix_Dense<double,2ul,2ul> *)((Vector_Dense<double,2ul> *)this_00 + 0x10);
    }
    return (matrix_type *)this;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
  local_48 = &PTR_s__workspace_llm4binary_github_lic_001723a0;
  console_format_abi_cxx11_(&local_40,(Disa *)0x0,(Log_Level)&local_48,in_RCX);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::to_string(&local_168,2);
  std::operator+(&local_148,"Incompatible matrix dimensions, ",&local_168);
  std::operator+(&local_128,&local_148,",");
  std::__cxx11::to_string(&local_188,2);
  std::operator+(&local_108,&local_128,&local_188);
  std::operator+(&local_e8,&local_108," vs. ");
  std::__cxx11::to_string
            (&local_1a8,
             ((long)(matrix->
                    super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                    ).
                    super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(matrix->
                   super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                   ).
                   super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  std::operator+(&local_c8,&local_e8,&local_1a8);
  std::operator+(&local_a8,&local_c8,",");
  __val = Matrix_Dense<double,_0UL,_0UL>::size_column(matrix);
  std::__cxx11::to_string(&sStack_1c8,__val);
  std::operator+(&local_88,&local_a8,&sStack_1c8);
  std::operator+(&local_68,&local_88,".");
  poVar1 = std::operator<<(poVar1,(string *)&local_68);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_40);
  exit(1);
}

Assistant:

constexpr matrix_type& operator-=(const Matrix_Dense<_type, _row_other, _col_other>& matrix) {
    ASSERT_DEBUG(size() == matrix.size(), "Incompatible matrix dimensions, " + std::to_string(size_row()) + "," +
                                          std::to_string(size_column()) + " vs. " + std::to_string(matrix.size_row()) +
                                          "," + std::to_string(matrix.size_column()) + ".");
    FOR(row, _row)(*this)[row] -= matrix[row];
    return *this;
  }